

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O1

Integer nga_sprs_array_create_(Integer *idim,Integer *jdim,Integer *type)

{
  Integer IVar1;
  
  if (*type - 0x3f2U < 6) {
    IVar1 = *(Integer *)(*type * 8 + 0x1b3cc0);
  }
  else {
    IVar1 = 0;
  }
  IVar1 = pnga_sprs_array_create(*idim,*jdim,IVar1,8);
  return IVar1;
}

Assistant:

Integer nga_sprs_array_create_(Integer *idim, Integer *jdim, Integer *type)
{
  int ctype;
  if (*type == MT_F_INT) {
    if (sizeof(Integer) == 4) {
      ctype = C_INT;
    } else {
      ctype = C_LONG;
    }
  } else if (*type == MT_F_REAL) {
    ctype = C_FLOAT;
  } else if (*type == MT_F_DBL) {
    ctype = C_DBL;
  } else if (*type == MT_F_SCPL) {
    ctype = C_SCPL;
  } else if (*type == MT_F_DCPL) {
    ctype = C_DCPL;
  }
  return wnga_sprs_array_create(*idim,*jdim,ctype,sizeof(Integer));
}